

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::handlePrint(Executor *this,FunctionCallNode *node)

{
  element_type *peVar1;
  pointer pVVar2;
  TypeName *pTVar3;
  StringValueAnalyser *this_00;
  ostream *poVar4;
  long *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  StringValueAnalyser analyser;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *args;
  Node *in_stack_00000108;
  string *in_stack_00000110;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *in_stack_ffffffffffffff08;
  StringValueAnalyser *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_c8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  ValueVisitor in_stack_ffffffffffffff58;
  
  (**(code **)(*in_RSI + 0x18))();
  std::__cxx11::
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::begin
            (in_stack_ffffffffffffff08);
  std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
            ((_List_const_iterator<std::shared_ptr<ExpressionNode>_> *)in_stack_ffffffffffffff10);
  peVar1 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x18a4e4);
  (*(peVar1->super_Node)._vptr_Node[2])(peVar1,in_RDI);
  pVVar2 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                     ((unique_ptr<Value,_std::default_delete<Value>_> *)0x18a500);
  pTVar3 = Value::getType(pVVar2);
  if (*pTVar3 != String) {
    pVVar2 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                       ((unique_ptr<Value,_std::default_delete<Value>_> *)0x18a51f);
    Value::getType(pVVar2);
    std::
    unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at((unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffff10,(key_type *)in_stack_ffffffffffffff08);
    std::operator+((char *)in_stack_ffffffffffffff58._vptr_ValueVisitor,in_stack_ffffffffffffff50);
    std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
    reportError(in_stack_00000110,in_stack_00000108);
  }
  StringValueAnalyser::StringValueAnalyser(in_stack_ffffffffffffff10);
  pVVar2 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                     ((unique_ptr<Value,_std::default_delete<Value>_> *)0x18a5ea);
  (*pVVar2->_vptr_Value[3])(pVVar2,&stack0xffffffffffffff58);
  StringValueAnalyser::getValue_abi_cxx11_((StringValueAnalyser *)&stack0xffffffffffffff58);
  this_00 = (StringValueAnalyser *)
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffff10);
  std::__cxx11::string::string(local_c8,(string *)this_00);
  poVar4 = std::operator<<((ostream *)(in_RDI + 0xb0),local_c8);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string(local_c8);
  StringValueAnalyser::~StringValueAnalyser(this_00);
  return;
}

Assistant:

void Executor::handlePrint(const FunctionCallNode& node)
{
  const auto& args = node.getArguments();
  (*args.begin())->accept(*this);

  if(value_->getType() != TypeName::String)
    reportError("Function print expected string, but got " +
      TypeNameStrings.at(value_->getType()) + "!", node);

  StringValueAnalyser analyser{};
  value_->accept(analyser);

  const auto str = analyser.getValue().value();
  stdout_ << str << "\n";
}